

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddAuto.c
# Opt level: O0

DdNode * Extra_bddSpaceEquations(DdManager *dd,DdNode *bSpace)

{
  DdNode *n;
  DdNode *n_00;
  DdNode *n_01;
  DdNode *zEquNeg;
  DdNode *zEquPos;
  DdNode *zRes;
  DdNode *bSpace_local;
  DdManager *dd_local;
  
  n = Extra_bddSpaceEquationsPos(dd,bSpace);
  Cudd_Ref(n);
  n_00 = Extra_bddSpaceEquationsNeg(dd,bSpace);
  Cudd_Ref(n_00);
  n_01 = Cudd_zddUnion(dd,n,n_00);
  Cudd_Ref(n_01);
  Cudd_RecursiveDerefZdd(dd,n);
  Cudd_RecursiveDerefZdd(dd,n_00);
  Cudd_Deref(n_01);
  return n_01;
}

Assistant:

DdNode * Extra_bddSpaceEquations( DdManager * dd, DdNode * bSpace )
{
    DdNode * zRes;
    DdNode * zEquPos;
    DdNode * zEquNeg;
    zEquPos = Extra_bddSpaceEquationsPos( dd, bSpace );  Cudd_Ref( zEquPos );
    zEquNeg = Extra_bddSpaceEquationsNeg( dd, bSpace );  Cudd_Ref( zEquNeg );
    zRes    = Cudd_zddUnion( dd, zEquPos, zEquNeg );     Cudd_Ref( zRes );
    Cudd_RecursiveDerefZdd( dd, zEquPos );
    Cudd_RecursiveDerefZdd( dd, zEquNeg );
    Cudd_Deref( zRes );
    return zRes;
}